

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O1

string * __thiscall
helics::errorMessageString_abi_cxx11_
          (string *__return_storage_ptr__,helics *this,ActionMessage *command)

{
  long lVar1;
  long *plVar2;
  char *__s;
  int in_stack_ffffffffffffffec;
  allocator<char> local_9;
  
  if (((byte)this[0x1a] & 0x10) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    plVar2 = &emptyStr_abi_cxx11_;
    if (0 < (int)((ulong)(*(long *)(this + 0xa8) - (long)*(long **)(this + 0xa0)) >> 5)) {
      plVar2 = *(long **)(this + 0xa0);
    }
    lVar1 = plVar2[1];
    if (lVar1 == 0) {
      __s = commandErrorString(in_stack_ffffffffffffffec);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,&local_9);
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*plVar2,lVar1 + *plVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string errorMessageString(const ActionMessage& command)
{
    if (checkActionFlag(command, error_flag)) {
        const auto& estring = command.getString(0);
        if (estring.empty()) {
            return commandErrorString(command.messageID);
        }
        return estring;
    }
    return std::string{};
}